

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<void> __thiscall
kj::Promise<void>::attach<kj::_::Deferred<kj::Function<void()>>>
          (Promise<void> *this,Deferred<kj::Function<void_()>_> *attachments)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *next;
  kj *this_00;
  NoInfer<kj::_::Deferred<kj::Function<void_()>_>_> *in_RDX;
  Deferred<kj::Function<void_()>_> *params;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::_::Deferred<kj::Function<void_()>_>_> local_48;
  Own<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::Function<void_()>_>_>,_kj::_::PromiseDisposer>
  local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  NoInfer<kj::_::Deferred<kj::Function<void_()>_>_> *local_20;
  Deferred<kj::Function<void_()>_> *attachments_local;
  Promise<void> *this_local;
  
  local_20 = in_RDX;
  attachments_local = attachments;
  this_local = this;
  next = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                   ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)attachments);
  this_00 = (kj *)fwd<kj::_::Deferred<kj::Function<void()>>>(local_20);
  tuple<kj::_::Deferred<kj::Function<void()>>>(&local_48,this_00,params);
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::Function<void()>>>,kj::_::PromiseDisposer,kj::_::Deferred<kj::Function<void()>>>
            ((PromiseDisposer *)&local_30,next,&local_48);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::
  Own<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::Function<void()>>>,void>
            ((Own<kj::_::PromiseNode,kj::_::PromiseDisposer> *)&local_28,&local_30);
  Promise(this,false,(OwnPromiseNode *)&local_28);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_28);
  Own<kj::_::AttachmentPromiseNode<kj::_::Deferred<kj::Function<void_()>_>_>,_kj::_::PromiseDisposer>
  ::~Own(&local_30);
  kj::_::Deferred<kj::Function<void_()>_>::~Deferred(&local_48);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}